

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzintel.cpp
# Opt level: O2

TPZConnect * __thiscall
TPZInterpolatedElement::SideConnect(TPZInterpolatedElement *this,int connect,int side)

{
  TPZCompMesh *pTVar1;
  int iVar2;
  TPZGeoEl *pTVar3;
  ostream *poVar4;
  int64_t nelem;
  TPZConnect *pTVar5;
  
  if (-1 < (side | connect)) {
    pTVar3 = TPZCompEl::Reference((TPZCompEl *)this);
    iVar2 = (**(code **)(*(long *)pTVar3 + 0xf0))(pTVar3);
    if (side <= iVar2) {
      pTVar1 = (this->super_TPZInterpolationSpace).super_TPZCompEl.fMesh;
      nelem = SideConnectIndex(this,connect,side);
      pTVar5 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&(pTVar1->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,nelem);
      return pTVar5;
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "Exiting SideConnect - has bad first or second parameter.");
  std::endl<char,std::char_traits<char>>(poVar4);
  if (SideConnect(int,int)::con == '\0') {
    iVar2 = __cxa_guard_acquire(&SideConnect(int,int)::con);
    if (iVar2 != 0) {
      TPZConnect::TPZConnect(&SideConnect::con);
      __cxa_atexit(TPZConnect::~TPZConnect,&SideConnect::con,&__dso_handle);
      __cxa_guard_release(&SideConnect(int,int)::con);
    }
  }
  return &SideConnect::con;
}

Assistant:

TPZConnect &TPZInterpolatedElement::SideConnect(int connect, int side) {
    if (side < 0 || connect < 0 || side > Reference()->NSides()) {
        LOGPZ_ERROR(logger, "Exiting SideConnect - has bad first or second parameter.");
        static TPZConnect con;
        return con;
    }
    return (fMesh->ConnectVec()[SideConnectIndex(connect, side)]);
}